

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
MatcherBase<const_absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>_&>::
~MatcherBase(MatcherBase<const_absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>_&>
             *this)

{
  MatcherBase<const_absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>_&>
  *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }